

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

path * module_build_path(path *__return_storage_ptr__,string *module)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type sVar6;
  pointer pcVar7;
  size_type sVar8;
  path local_a8;
  path local_88;
  path local_68;
  path local_48;
  
  sVar6 = module->_M_string_length;
  if (sVar6 != 0) {
    pcVar7 = (module->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      if (pcVar7[sVar8] == '~') {
        pcVar7[sVar8] = '/';
      }
      sVar8 = sVar8 + 1;
    } while (sVar6 != sVar8);
  }
  paVar2 = &local_88.m_pathname.field_2;
  local_88.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"libs","");
  paVar3 = &local_48.m_pathname.field_2;
  pcVar7 = (module->_M_dataplus)._M_p;
  local_48.m_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar7,pcVar7 + module->_M_string_length);
  boost::filesystem::path::operator/=(&local_88,&local_48);
  paVar4 = &local_a8.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_pathname._M_dataplus._M_p == paVar2) {
    local_a8.m_pathname.field_2._8_4_ = local_88.m_pathname.field_2._8_4_;
    local_a8.m_pathname.field_2._12_4_ = local_88.m_pathname.field_2._12_4_;
    local_a8.m_pathname._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_a8.m_pathname._M_dataplus._M_p = local_88.m_pathname._M_dataplus._M_p;
  }
  local_a8.m_pathname.field_2._M_allocated_capacity._4_4_ =
       local_88.m_pathname.field_2._M_allocated_capacity._4_4_;
  local_a8.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_88.m_pathname.field_2._M_allocated_capacity._0_4_;
  local_a8.m_pathname._M_string_length = local_88.m_pathname._M_string_length;
  local_88.m_pathname._M_string_length = 0;
  local_88.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_88.m_pathname.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar5 = &local_68.m_pathname.field_2;
  local_88.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  local_68.m_pathname._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"build","");
  boost::filesystem::path::operator/=(&local_a8,&local_68);
  paVar1 = &(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_pathname._M_dataplus._M_p == paVar4) {
    paVar1->_M_allocated_capacity = local_a8.m_pathname.field_2._M_allocated_capacity;
    *(ulong *)((long)&(__return_storage_ptr__->m_pathname).field_2 + 8) =
         CONCAT44(local_a8.m_pathname.field_2._12_4_,local_a8.m_pathname.field_2._8_4_);
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = local_a8.m_pathname._M_dataplus._M_p;
    (__return_storage_ptr__->m_pathname).field_2._M_allocated_capacity =
         local_a8.m_pathname.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_pathname)._M_string_length = local_a8.m_pathname._M_string_length;
  local_a8.m_pathname._M_string_length = 0;
  local_a8.m_pathname.field_2._M_allocated_capacity =
       local_a8.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8.m_pathname._M_dataplus._M_p = (pointer)paVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_pathname._M_dataplus._M_p != paVar5) {
    operator_delete(local_68.m_pathname._M_dataplus._M_p,
                    local_68.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_a8.m_pathname._M_dataplus._M_p,
                    local_a8.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_48.m_pathname._M_dataplus._M_p,
                    local_48.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_88.m_pathname._M_dataplus._M_p,
                    CONCAT44(local_88.m_pathname.field_2._M_allocated_capacity._4_4_,
                             local_88.m_pathname.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static fs::path module_build_path( std::string module )
{
    std::replace( module.begin(), module.end(), '~', '/' );
    return fs::path( "libs" ) / module / "build";
}